

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_block_test.cc
# Opt level: O0

int64_t anon_unknown.dwarf_11af45a::BlockErrorLpWrapper<&av1_block_error_lp_sse2>
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bps)

{
  bool bVar1;
  int64_t iVar2;
  undefined8 *in_RCX;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  intptr_t in_stack_000000a8;
  int16_t *in_stack_000000b0;
  int16_t *in_stack_000000b8;
  AssertHelper *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  Type in_stack_ffffffffffffffcc;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffffd0;
  
  uVar3 = 8;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(int *)in_stack_ffffffffffffffa0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0._M_head_impl);
    testing::AssertionResult::failure_message((AssertionResult *)0xb1d2c2);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffffd0._M_head_impl,in_stack_ffffffffffffffcc,
               (char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
               in_stack_ffffffffffffffb0);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffffa0);
    testing::Message::~Message((Message *)0xb1d30e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb1d35e);
  *in_RCX = 0xffffffffffffffff;
  iVar2 = av1_block_error_lp_sse2(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
  return iVar2;
}

Assistant:

int64_t BlockErrorLpWrapper(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                            intptr_t block_size, int64_t *ssz, int bps) {
  EXPECT_EQ(bps, 8);
  *ssz = -1;
  return fn(reinterpret_cast<const int16_t *>(coeff),
            reinterpret_cast<const int16_t *>(dqcoeff), block_size);
}